

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O0

REF_STATUS ref_face_inspect(REF_FACE ref_face)

{
  uint uVar1;
  uint local_48;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT sort [4];
  REF_INT orig [4];
  int local_20;
  uint local_1c;
  REF_INT node;
  REF_INT face;
  REF_FACE ref_face_local;
  
  printf("ref_face = %p\n",ref_face);
  printf(" n = %d\n",(ulong)(uint)ref_face->n);
  printf(" max = %d\n",(ulong)(uint)ref_face->max);
  for (local_1c = 0; (int)local_1c < ref_face->n; local_1c = local_1c + 1) {
    printf("face %4d : %4d %4d %4d %4d\n",(ulong)local_1c,
           (ulong)(uint)ref_face->f2n[(int)(local_1c << 2)],
           (ulong)(uint)ref_face->f2n[(int)(local_1c * 4 + 1)],
           (ulong)(uint)ref_face->f2n[(int)(local_1c * 4 + 2)],
           (ulong)(uint)ref_face->f2n[(int)(local_1c * 4 + 3)]);
  }
  local_1c = 0;
  while( true ) {
    if (ref_face->n <= (int)local_1c) {
      return 0;
    }
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      sort[(long)local_20 + 2] = ref_face->f2n[(int)(local_20 + local_1c * 4)];
    }
    uVar1 = ref_sort_insertion_int(4,sort + 2,(REF_INT *)&local_48);
    if (uVar1 != 0) break;
    printf("sort %4d : %4d %4d %4d %4d\n",(ulong)local_1c,(ulong)local_48,
           (ulong)(uint)ref_private_macro_code_rss,(ulong)(uint)sort[0],(ulong)(uint)sort[1]);
    local_1c = local_1c + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0x62,
         "ref_face_inspect",(ulong)uVar1,"sort");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_face_inspect(REF_FACE ref_face) {
  REF_INT face, node, orig[4], sort[4];

  printf("ref_face = %p\n", (void *)ref_face);
  printf(" n = %d\n", ref_face_n(ref_face));
  printf(" max = %d\n", ref_face_max(ref_face));
  for (face = 0; face < ref_face_n(ref_face); face++)
    printf("face %4d : %4d %4d %4d %4d\n", face,
           ref_face_f2n(ref_face, 0, face), ref_face_f2n(ref_face, 1, face),
           ref_face_f2n(ref_face, 2, face), ref_face_f2n(ref_face, 3, face));
  for (face = 0; face < ref_face_n(ref_face); face++) {
    for (node = 0; node < 4; node++)
      orig[node] = ref_face_f2n(ref_face, node, face);
    RSS(ref_sort_insertion_int(4, orig, sort), "sort");
    printf("sort %4d : %4d %4d %4d %4d\n", face, sort[0], sort[1], sort[2],
           sort[3]);
  }
  return REF_SUCCESS;
}